

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O2

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateRandomUniformStaticLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  bool bVar1;
  RandomUniformStaticLayerParams *pRVar2;
  string err;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  Result r;
  
  Result::Result(&r);
  validateInputCount((Result *)&err,layer,0,0);
  Result::operator=(&r,(Result *)&err);
  std::__cxx11::string::~string((string *)&err._M_string_length);
  bVar1 = Result::good(&r);
  if (bVar1) {
    validateOutputCount((Result *)&err,layer,1,1);
    Result::operator=(&r,(Result *)&err);
    std::__cxx11::string::~string((string *)&err._M_string_length);
  }
  pRVar2 = Specification::NeuralNetworkLayer::randomuniformstatic(layer);
  if ((pRVar2->outputshape_).current_size_ == 0) {
    std::operator+(&local_60,"Target shape is required parameter for \'",(layer->name_).ptr_);
    std::operator+(&err,&local_60,"\' layer.");
    std::__cxx11::string::~string((string *)&local_60);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
  }
  else {
    if (pRVar2->minval_ < pRVar2->maxval_ || pRVar2->minval_ == pRVar2->maxval_) {
      Result::Result(__return_storage_ptr__,&r);
      goto LAB_0059fa97;
    }
    std::operator+(&local_60,"Value of minval should be smaller than maxval for \'",
                   (layer->name_).ptr_);
    std::operator+(&err,&local_60,"\' layer.");
    std::__cxx11::string::~string((string *)&local_60);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
  }
  std::__cxx11::string::~string((string *)&err);
LAB_0059fa97:
  std::__cxx11::string::~string((string *)&r.m_message);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateRandomUniformStaticLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 0, 0);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }
    const auto& params = layer.randomuniformstatic();
    if (params.outputshape_size() == 0) {
        const std::string err = "Target shape is required parameter for '" + layer.name() + "' layer.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    if (params.minval() > params.maxval()) {
        const std::string err = "Value of minval should be smaller than maxval for '" + layer.name() + "' layer.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    return r;
}